

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetLinkDirectories
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language)

{
  cmMakefile *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  bool local_1d9;
  allocator<char> local_1a1;
  string local_1a0;
  undefined1 local_180 [8];
  EvaluatedTargetPropertyEntries entries;
  undefined1 local_158 [6];
  bool debugDirectories;
  undefined1 local_138 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  allocator<char> local_109;
  string local_108;
  undefined1 local_e8 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueDirectories;
  string *language_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *result;
  
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(__return_storage_ptr__);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dagChecker.CheckResult);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"LINK_DIRECTORIES",&local_109);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_e8,this,&local_108,
             (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_138);
  this_00 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_158,"CMAKE_DEBUG_TARGET_PROPERTIES",
             (allocator<char> *)&entries.field_0x1f);
  cmMakefile::GetDefExpandList
            (this_00,(string *)local_158,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_138,false);
  std::__cxx11::string::~string((string *)local_158);
  std::allocator<char>::~allocator((allocator<char> *)&entries.field_0x1f);
  local_1d9 = false;
  if ((this->DebugLinkDirectoriesDone & 1U) == 0) {
    local_1d9 = ::cm::
                contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[17],_0>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_138,(char (*) [17])0xd5d422);
  }
  entries._30_1_ = local_1d9;
  bVar1 = cmGlobalGenerator::GetConfigureDoneCMP0026(this->GlobalGenerator);
  if (bVar1) {
    this->DebugLinkDirectoriesDone = true;
  }
  anon_unknown.dwarf_124178a::EvaluateTargetPropertyEntries
            ((EvaluatedTargetPropertyEntries *)local_180,this,config,language,
             (cmGeneratorExpressionDAGChecker *)local_e8,&this->LinkDirectoriesEntries);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"INTERFACE_LINK_DIRECTORIES",&local_1a1);
  PVar2 = GetPolicyStatusCMP0099(this);
  anon_unknown.dwarf_124178a::AddInterfaceEntries
            (this,config,&local_1a0,language,(cmGeneratorExpressionDAGChecker *)local_e8,
             (EvaluatedTargetPropertyEntries *)local_180,Yes,(uint)(PVar2 == NEW));
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  anon_unknown.dwarf_124178a::processLinkDirectories
            (this,(EvaluatedTargetPropertyEntries *)local_180,__return_storage_ptr__,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&dagChecker.CheckResult,(bool)(entries._30_1_ & 1));
  anon_unknown.dwarf_124178a::EvaluatedTargetPropertyEntries::~EvaluatedTargetPropertyEntries
            ((EvaluatedTargetPropertyEntries *)local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_138);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_e8);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&dagChecker.CheckResult);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetLinkDirectories(
  std::string const& config, std::string const& language) const
{
  std::vector<BT<std::string>> result;
  std::unordered_set<std::string> uniqueDirectories;

  cmGeneratorExpressionDAGChecker dagChecker(this, "LINK_DIRECTORIES", nullptr,
                                             nullptr);

  std::vector<std::string> debugProperties;
  this->Makefile->GetDefExpandList("CMAKE_DEBUG_TARGET_PROPERTIES",
                                   debugProperties);

  bool debugDirectories = !this->DebugLinkDirectoriesDone &&
    cm::contains(debugProperties, "LINK_DIRECTORIES");

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugLinkDirectoriesDone = true;
  }

  EvaluatedTargetPropertyEntries entries = EvaluateTargetPropertyEntries(
    this, config, language, &dagChecker, this->LinkDirectoriesEntries);

  AddInterfaceEntries(this, config, "INTERFACE_LINK_DIRECTORIES", language,
                      &dagChecker, entries, IncludeRuntimeInterface::Yes,
                      this->GetPolicyStatusCMP0099() == cmPolicies::NEW
                        ? LinkInterfaceFor::Link
                        : LinkInterfaceFor::Usage);

  processLinkDirectories(this, entries, result, uniqueDirectories,
                         debugDirectories);

  return result;
}